

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

void MiscSetEnvArray(void)

{
  _environ = palEnvironment;
  return;
}

Assistant:

void
MiscSetEnvArray(void)
{
#if HAVE__NSGETENVIRON
    *(_NSGetEnviron()) = palEnvironment;
#else   // HAVE__NSGETENVIRON
    extern char **environ;
    environ = palEnvironment;
#endif  // HAVE__NSGETENVIRON
}